

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O3

int __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::remove
          (UArrIntermediateNode *this,char *__filename)

{
  int iVar1;
  bool bVar2;
  int in_EAX;
  undefined1 in_DL;
  long lVar3;
  Top TVar4;
  int iStack_43;
  undefined4 uStack_33;
  
  uStack_33 = CONCAT13(in_DL,(int3)((ulong)__filename >> 0x28));
  if (0 < *(int *)&(this->super_IntermediateNode).field_0x14) {
    lVar3 = 0;
    do {
      TVar4 = Kernel::TermList::top(&this->_nodes[lVar3]->_term);
      iStack_43 = TVar4._inner._inner._content._4_4_;
      if (((byte)__filename & 1) == (TVar4._inner._inner._0_1_ & 1)) {
        bVar2 = (char)((ulong)__filename >> 0x28) == TVar4._inner._inner._content[4];
        if (((ulong)__filename & 1) != 0) {
          bVar2 = uStack_33 == iStack_43;
        }
        if (((int)((ulong)__filename >> 8) == TVar4._inner._inner._content._0_4_) && (bVar2)) {
          iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
          *(int *)&(this->super_IntermediateNode).field_0x14 = iVar1 + -1;
          this->_nodes[lVar3] = this->_nodes[(long)iVar1 + -1];
          this->_nodes[(long)iVar1 + -1] = (Node *)0x0;
          return iVar1;
        }
      }
      lVar3 = lVar3 + 1;
      in_EAX = *(int *)&(this->super_IntermediateNode).field_0x14;
    } while (lVar3 < in_EAX);
  }
  return in_EAX;
}

Assistant:

void SubstitutionTree<LeafData_>::UArrIntermediateNode::remove(TermList::Top t)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      _size--;
      _nodes[i]=_nodes[_size];
      _nodes[_size]=0;
      return;
    }
  }
  ASSERTION_VIOLATION;
}